

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaffeConverter.cpp
# Opt level: O2

void CoreMLConverter::convertCaffeNetwork
               (NetParameter *caffeSpecWeights,NetParameter *caffeSpecProto,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
               *meanImageBlobProto,Model *modelSpec,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *isBGR,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                      *redBias,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               *blueBias,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               *greenBias,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               *grayBias,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               *scale,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *imageInputs,string *classInputPath,string *predictedFeatureName)

{
  _Rb_tree_node_base *p_Var1;
  void **ppvVar2;
  pointer *pplVar3;
  int iVar4;
  Rep *pRVar5;
  void *pvVar6;
  int64 *piVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  NeuralNetworkClassifier *this;
  Type *pTVar12;
  mapped_type_conflict1 *pmVar13;
  NeuralNetwork *pNVar14;
  ostream *poVar15;
  Type *pTVar16;
  mapped_type *pmVar17;
  _Base_ptr p_Var18;
  iterator iVar19;
  ModelDescription *pMVar20;
  FeatureDescription *pFVar21;
  FeatureType *pFVar22;
  iterator iVar23;
  const_iterator cVar24;
  ImageFeatureType *pIVar25;
  ArrayFeatureType *pAVar26;
  const_iterator cVar27;
  mapped_type *pmVar28;
  NeuralNetworkPreprocessing *pNVar29;
  iterator iVar30;
  mapped_type *pmVar31;
  NeuralNetworkImageScaler *pNVar32;
  const_iterator cVar33;
  mapped_type_conflict *pmVar34;
  NeuralNetworkMeanImage *pNVar36;
  Type *pTVar37;
  DictionaryFeatureType *this_00;
  istream *piVar38;
  StringVector *pSVar39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar40;
  runtime_error *prVar41;
  int iVar42;
  void **ppvVar43;
  int64_t *val;
  int64 *piVar44;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this_01;
  int layer_id;
  int iVar45;
  long lVar46;
  BlobShape *pBVar47;
  int i;
  int iVar48;
  int iVar49;
  _Rb_tree_node_base *unaff_R12;
  RepeatedField<float> *pRVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  size_t i_2;
  ulong uVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  long lVar59;
  float fVar60;
  int local_538;
  string class_buffer;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inputNames;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  networkInputs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
  mapBlobNameToDimensions;
  convertCaffeLayerFn layerConvertFn;
  BlobShape *local_340;
  int local_334;
  int local_330;
  int local_32c;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  networkOutputs;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputNames;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  caffeNetworkInputNames;
  vector<long,_std::allocator<long>_> dims;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  mapCaffeLayerNamesToIndex;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mappingDataBlobNames;
  int64 iVar35;
  
  if ((caffeSpecProto->layers_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    if ((caffeSpecWeights->layers_).super_RepeatedPtrFieldBase.current_size_ == 0) {
      bVar8 = std::operator!=(classInputPath,"");
      if (bVar8) {
        this = CoreML::Specification::Model::mutable_neuralnetworkclassifier(modelSpec);
        modelSpec->specificationversion_ = 5;
        mappingDataBlobNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &mappingDataBlobNames._M_t._M_impl.super__Rb_tree_header._M_header;
        mappingDataBlobNames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        mappingDataBlobNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
        ;
        mappingDataBlobNames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header._M_header;
        mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        mapCaffeLayerNamesToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &mapCaffeLayerNamesToIndex._M_t._M_impl.super__Rb_tree_header._M_header;
        mapCaffeLayerNamesToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        mapCaffeLayerNamesToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        mapCaffeLayerNamesToIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        mapCaffeLayerNamesToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             mapCaffeLayerNamesToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        mappingDataBlobNames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             mappingDataBlobNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (iVar45 = 0;
            iVar45 < (caffeSpecWeights->layer_).super_RepeatedPtrFieldBase.current_size_;
            iVar45 = iVar45 + 1) {
          pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                              (&(caffeSpecWeights->layer_).super_RepeatedPtrFieldBase,iVar45);
          if (((pTVar12->_has_bits_).has_bits_[0] & 1) != 0) {
            pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                                (&(caffeSpecWeights->layer_).super_RepeatedPtrFieldBase,iVar45);
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::operator[](&mapCaffeLayerNamesToIndex,(pTVar12->name_).ptr_);
            *pmVar13 = iVar45;
          }
        }
        caffeNetworkInputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &caffeNetworkInputNames._M_t._M_impl.super__Rb_tree_header._M_header;
        caffeNetworkInputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        caffeNetworkInputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        caffeNetworkInputNames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        iVar45 = (caffeSpecProto->layer_).super_RepeatedPtrFieldBase.current_size_;
        caffeNetworkInputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             caffeNetworkInputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        poVar15 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar15 = std::operator<<(poVar15,
                                  "================= Starting Conversion from Caffe to CoreML ======================"
                                 );
        std::endl<char,std::char_traits<char>>(poVar15);
        for (inputNames._M_t._M_impl._0_4_ = 0; (int)inputNames._M_t._M_impl._0_4_ < iVar45;
            inputNames._M_t._M_impl._0_4_ = inputNames._M_t._M_impl._0_4_ + 1) {
          pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                              (&(caffeSpecProto->layer_).super_RepeatedPtrFieldBase,
                               inputNames._M_t._M_impl._0_4_);
          validateCaffeLayerTypeAndName(pTVar12);
          iVar49 = (pTVar12->bottom_).super_RepeatedPtrFieldBase.current_size_;
          iVar4 = (pTVar12->top_).super_RepeatedPtrFieldBase.current_size_;
          poVar15 = std::operator<<((ostream *)&std::cout,"Layer ");
          poVar15 = (ostream *)
                    std::ostream::operator<<((ostream *)poVar15,inputNames._M_t._M_impl._0_4_);
          poVar15 = std::operator<<(poVar15,": Type: \'");
          poVar15 = std::operator<<(poVar15,(string *)(pTVar12->type_).ptr_);
          poVar15 = std::operator<<(poVar15,"\', Name: \'");
          poVar15 = std::operator<<(poVar15,(string *)(pTVar12->name_).ptr_);
          std::operator<<(poVar15,"\'. ");
          if (0 < iVar49) {
            std::operator<<((ostream *)&std::cout,"Input(s): ");
            unaff_R12 = (_Rb_tree_node_base *)0x0;
            while (iVar48 = (int)unaff_R12, iVar49 != iVar48) {
              if (iVar48 != 0) {
                std::operator<<((ostream *)&std::cout,", ");
              }
              poVar15 = std::operator<<((ostream *)&std::cout,"\'");
              pTVar16 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                  (&(pTVar12->bottom_).super_RepeatedPtrFieldBase,iVar48);
              poVar15 = std::operator<<(poVar15,(string *)pTVar16);
              std::operator<<(poVar15,"\'");
              unaff_R12 = (_Rb_tree_node_base *)(ulong)(iVar48 + 1);
            }
            std::operator<<((ostream *)&std::cout,". ");
          }
          if (0 < iVar4) {
            std::operator<<((ostream *)&std::cout,"Output(s): ");
            unaff_R12 = (_Rb_tree_node_base *)0x0;
            while (iVar49 = (int)unaff_R12, iVar4 != iVar49) {
              if (iVar49 != 0) {
                std::operator<<((ostream *)&std::cout,", ");
              }
              poVar15 = std::operator<<((ostream *)&std::cout,"\'");
              pTVar16 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                  (&(pTVar12->top_).super_RepeatedPtrFieldBase,iVar49);
              poVar15 = std::operator<<(poVar15,(string *)pTVar16);
              std::operator<<(poVar15,"\'");
              unaff_R12 = (_Rb_tree_node_base *)(ulong)(iVar49 + 1);
            }
            poVar15 = std::operator<<((ostream *)&std::cout,".");
            std::endl<char,std::char_traits<char>>(poVar15);
          }
          caffeLayerRegistry(&layerConvertFn,(pTVar12->type_).ptr_);
          dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)&this->layers_;
          if (layerConvertFn.super__Function_base._M_manager == (_Manager_type)0x0) {
            dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)caffeSpecProto;
            dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)caffeSpecWeights;
            std::__throw_bad_function_call();
LAB_0047e5cc:
            std::__throw_bad_function_call();
            goto LAB_0047e5d1;
          }
          dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)caffeSpecProto;
          dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)caffeSpecWeights;
          (*(code *)CONCAT44(layerConvertFn._M_invoker._4_4_,(int)layerConvertFn._M_invoker))
                    (&layerConvertFn,&dims);
          std::_Function_base::~_Function_base(&layerConvertFn.super__Function_base);
        }
        poVar15 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar15 = std::operator<<(poVar15,
                                  "================= Summary of the conversion: ==================================="
                                 );
        std::endl<char,std::char_traits<char>>(poVar15);
        if (mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&dims);
          pplVar3 = &dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          std::operator<<((ostream *)pplVar3,"Unable to infer input name and dimensions. ");
          poVar15 = std::operator<<((ostream *)pplVar3,
                                    "Please provide a .prototxt file with \'Input\' layer and dimensions defined."
                                   );
          std::endl<char,std::char_traits<char>>(poVar15);
          prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar41,(string *)&layerConvertFn);
          __cxa_throw(prVar41,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        poVar15 = std::operator<<((ostream *)&std::cout,
                                  "Detected input(s) and shape(s) (ignoring batch size):");
        std::endl<char,std::char_traits<char>>(poVar15);
        for (p_Var18 = mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var18 !=
            &mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header;
            p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
          poVar15 = std::operator<<((ostream *)&std::cout,"\'");
          poVar15 = std::operator<<(poVar15,(string *)(p_Var18 + 1));
          std::operator<<(poVar15,"\' : ");
          pmVar17 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                    ::at(&mapBlobNameToDimensions,(key_type *)(p_Var18 + 1));
          std::vector<long,_std::allocator<long>_>::vector
                    ((vector<long,_std::allocator<long>_> *)
                     &dims.super__Vector_base<long,_std::allocator<long>_>,pmVar17);
          for (uVar54 = 0;
              uVar54 < (ulong)((long)dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 3); uVar54 = uVar54 + 1) {
            if (uVar54 != 0) {
              std::operator<<((ostream *)&std::cout,", ");
            }
            std::ostream::_M_insert<long>((long)&std::cout);
          }
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                    (&dims.super__Vector_base<long,_std::allocator<long>_>);
        }
        inputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &inputNames._M_t._M_impl.super__Rb_tree_header._M_header;
        inputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        inputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        inputNames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        outputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &outputNames._M_t._M_impl.super__Rb_tree_header._M_header;
        outputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        outputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        outputNames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        pRVar5 = (this->layers_).super_RepeatedPtrFieldBase.rep_;
        ppvVar43 = pRVar5->elements;
        if (pRVar5 == (Rep *)0x0) {
          ppvVar43 = (void **)0x0;
        }
        ppvVar2 = ppvVar43 + (this->layers_).super_RepeatedPtrFieldBase.current_size_;
        inputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             inputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        outputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             outputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (; ppvVar43 != ppvVar2; ppvVar43 = ppvVar43 + 1) {
          pvVar6 = *ppvVar43;
          lVar46 = *(long *)((long)pvVar6 + 0x20) + 8;
          if (*(long *)((long)pvVar6 + 0x20) == 0) {
            lVar46 = 0;
          }
          iVar45 = *(int *)((long)pvVar6 + 0x18);
          for (lVar59 = 0; (long)iVar45 * 8 != lVar59; lVar59 = lVar59 + 8) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&inputNames,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar46 + lVar59));
          }
          lVar46 = *(long *)((long)pvVar6 + 0x38) + 8;
          if (*(long *)((long)pvVar6 + 0x38) == 0) {
            lVar46 = 0;
          }
          iVar45 = *(int *)((long)pvVar6 + 0x30);
          for (lVar59 = 0; (long)iVar45 * 8 != lVar59; lVar59 = lVar59 + 8) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&outputNames,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar46 + lVar59));
          }
        }
        networkInputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &networkInputs._M_t._M_impl.super__Rb_tree_header._M_header;
        networkInputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        networkInputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        networkInputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        networkInputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             networkInputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::
        __set_difference<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>,std::insert_iterator<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (inputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                   &inputNames._M_t._M_impl.super__Rb_tree_header,
                   outputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                   &outputNames._M_t._M_impl.super__Rb_tree_header,&networkInputs);
        for (p_Var18 = caffeNetworkInputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var18 != &caffeNetworkInputNames._M_t._M_impl.super__Rb_tree_header
            ; p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
          p_Var1 = p_Var18 + 1;
          iVar19 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&networkInputs,(key_type *)p_Var1);
          if ((_Rb_tree_header *)iVar19._M_node == &networkInputs._M_t._M_impl.super__Rb_tree_header
             ) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&networkInputs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var1);
            std::__cxx11::stringstream::stringstream((stringstream *)&dims);
            poVar15 = std::operator<<((ostream *)
                                      &dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage,
                                      "WARNING: The input: \'");
            poVar15 = std::operator<<(poVar15,(string *)p_Var1);
            poVar15 = std::operator<<(poVar15,
                                      "\', is dangling i.e. it does not feed into any other layer of the network."
                                     );
            std::endl<char,std::char_traits<char>>(poVar15);
            std::__cxx11::stringbuf::str();
            std::operator<<((ostream *)&std::cout,(string *)&layerConvertFn);
            std::__cxx11::string::~string((string *)&layerConvertFn);
            std::__cxx11::stringstream::~stringstream((stringstream *)&dims);
          }
        }
        networkOutputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &networkOutputs._M_t._M_impl.super__Rb_tree_header._M_header;
        networkOutputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        networkOutputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        networkOutputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        networkOutputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             networkOutputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::
        __set_difference<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>,std::insert_iterator<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (outputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                   &outputNames._M_t._M_impl.super__Rb_tree_header,
                   inputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                   &inputNames._M_t._M_impl.super__Rb_tree_header,&networkOutputs);
        pMVar20 = CoreML::Specification::Model::mutable_description(modelSpec);
        if (networkInputs._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar41,"Unable to find any input layer for the network.");
          __cxa_throw(prVar41,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        for (p_Var18 = networkInputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var18 != &networkInputs._M_t._M_impl.super__Rb_tree_header;
            p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
          pFVar21 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
                    Add(&pMVar20->input_);
          unaff_R12 = p_Var18 + 1;
          CoreML::Specification::FeatureDescription::set_name(pFVar21,(string *)unaff_R12);
          pFVar22 = CoreML::Specification::FeatureDescription::mutable_type(pFVar21);
          iVar23 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                   ::find(&mapBlobNameToDimensions._M_t,(key_type *)unaff_R12);
          if ((_Rb_tree_header *)iVar23._M_node ==
              &mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header) {
LAB_0047e5d1:
            std::__cxx11::stringstream::stringstream((stringstream *)&dims);
            poVar15 = std::operator<<((ostream *)
                                      &dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage,
                                      "Unable to infer shape for the Input \'");
            poVar15 = std::operator<<(poVar15,(string *)unaff_R12);
            poVar15 = std::operator<<(poVar15,"\'.");
            std::endl<char,std::char_traits<char>>(poVar15);
            prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar41,(string *)&layerConvertFn);
            __cxa_throw(prVar41,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          cVar24 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&imageInputs->_M_t,(key_type *)unaff_R12);
          if ((_Rb_tree_header *)cVar24._M_node ==
              &(imageInputs->_M_t)._M_impl.super__Rb_tree_header) {
            pAVar26 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar22);
            pAVar26->datatype_ = 0x10040;
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                                    *)&mapBlobNameToDimensions._M_t,(key_type *)unaff_R12);
            piVar7 = (pmVar17->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            for (piVar44 = (pmVar17->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                           super__Vector_impl_data._M_start; piVar44 != piVar7;
                piVar44 = piVar44 + 1) {
              CoreML::Specification::ArrayFeatureType::add_shape(pAVar26,*piVar44);
            }
          }
          else {
            pIVar25 = CoreML::Specification::FeatureType::mutable_imagetype(pFVar22);
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                                    *)&mapBlobNameToDimensions._M_t,(key_type *)unaff_R12);
            if (*(pmVar17->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start == 1) {
              pIVar25->colorspace_ = 10;
            }
            else {
              cVar27 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                       ::find(&isBGR->_M_t,(key_type *)unaff_R12);
              if (((_Rb_tree_header *)cVar27._M_node == &(isBGR->_M_t)._M_impl.super__Rb_tree_header
                  ) || (pmVar28 = std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                                  ::at(isBGR,(key_type *)unaff_R12), *pmVar28 != true)) {
                pIVar25->colorspace_ = 0x14;
              }
              else {
                pIVar25->colorspace_ = 0x1e;
              }
            }
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                                    *)&mapBlobNameToDimensions._M_t,(key_type *)unaff_R12);
            pIVar25->height_ =
                 (pmVar17->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start[1];
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                                    *)&mapBlobNameToDimensions._M_t,(key_type *)unaff_R12);
            pIVar25->width_ =
                 (pmVar17->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start[2];
            pNVar29 = google::protobuf::
                      RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::Add
                                (&this->preprocessing_);
            iVar30 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
                     ::find(&meanImageBlobProto->_M_t,(key_type *)unaff_R12);
            if ((_Rb_tree_header *)iVar30._M_node ==
                &(meanImageBlobProto->_M_t)._M_impl.super__Rb_tree_header) {
              CoreML::Specification::NeuralNetworkPreprocessing::set_featurename
                        (pNVar29,(string *)unaff_R12);
              pNVar32 = CoreML::Specification::NeuralNetworkPreprocessing::mutable_scaler(pNVar29);
              cVar33 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                       ::find(&scale->_M_t,(key_type *)unaff_R12);
              fVar60 = 1.0;
              if ((_Rb_tree_header *)cVar33._M_node != &(scale->_M_t)._M_impl.super__Rb_tree_header)
              {
                pmVar34 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                          ::at(scale,(key_type *)unaff_R12);
                fVar60 = (float)*pmVar34;
              }
              pNVar32->channelscale_ = fVar60;
              cVar33 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                       ::find(&redBias->_M_t,(key_type *)unaff_R12);
              if ((_Rb_tree_header *)cVar33._M_node !=
                  &(redBias->_M_t)._M_impl.super__Rb_tree_header) {
                pmVar34 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                          ::at(redBias,(key_type *)unaff_R12);
                pNVar32->redbias_ = (float)*pmVar34;
              }
              cVar33 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                       ::find(&greenBias->_M_t,(key_type *)unaff_R12);
              if ((_Rb_tree_header *)cVar33._M_node !=
                  &(greenBias->_M_t)._M_impl.super__Rb_tree_header) {
                pmVar34 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                          ::at(greenBias,(key_type *)unaff_R12);
                pNVar32->greenbias_ = (float)*pmVar34;
              }
              cVar33 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                       ::find(&blueBias->_M_t,(key_type *)unaff_R12);
              if ((_Rb_tree_header *)cVar33._M_node !=
                  &(blueBias->_M_t)._M_impl.super__Rb_tree_header) {
                pmVar34 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                          ::at(blueBias,(key_type *)unaff_R12);
                pNVar32->bluebias_ = (float)*pmVar34;
              }
              cVar33 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                       ::find(&grayBias->_M_t,(key_type *)unaff_R12);
              if ((_Rb_tree_header *)cVar33._M_node !=
                  &(grayBias->_M_t)._M_impl.super__Rb_tree_header) {
                pmVar34 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                          ::at(grayBias,(key_type *)unaff_R12);
                pNVar32->graybias_ = (float)*pmVar34;
              }
            }
            else {
              pmVar31 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
                        ::at(meanImageBlobProto,(key_type *)unaff_R12);
              caffe::BlobProto::BlobProto((BlobProto *)&layerConvertFn,pmVar31);
              iVar45 = (int)layerConvertFn._M_invoker;
              if ((int)layerConvertFn._M_invoker == 0) {
                std::__cxx11::stringstream::stringstream((stringstream *)&dims);
                poVar15 = std::operator<<((ostream *)
                                          &dims.super__Vector_base<long,_std::allocator<long>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                                          "There is no data in the mean image binary proto file specified for input: \'"
                                         );
                poVar15 = std::operator<<(poVar15,(string *)unaff_R12);
                poVar15 = std::operator<<(poVar15,"\'.");
                std::endl<char,std::char_traits<char>>(poVar15);
                prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(prVar41,(string *)&class_buffer);
                __cxa_throw(prVar41,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              pmVar17 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                        ::operator[](&mapBlobNameToDimensions,(key_type *)unaff_R12);
              iVar49 = (int)*(pmVar17->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                             super__Vector_impl_data._M_start;
              pmVar17 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                        ::operator[](&mapBlobNameToDimensions,(key_type *)unaff_R12);
              iVar4 = (int)(pmVar17->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                           super__Vector_impl_data._M_start[1];
              pmVar17 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                        ::operator[](&mapBlobNameToDimensions,(key_type *)unaff_R12);
              pBVar47 = local_340;
              if (local_340 == (BlobShape *)0x0) {
                pBVar47 = (BlobShape *)&caffe::_BlobShape_default_instance_;
              }
              iVar48 = (int)(pmVar17->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                            super__Vector_impl_data._M_start[2];
              iVar58 = (pBVar47->dim_).current_size_;
              if (iVar58 == 3) {
                iVar35 = caffe::BlobShape::dim(pBVar47,0);
                iVar58 = (int)iVar35;
                pBVar47 = local_340;
                if (local_340 == (BlobShape *)0x0) {
                  pBVar47 = (BlobShape *)&caffe::_BlobShape_default_instance_;
                }
                iVar35 = caffe::BlobShape::dim(pBVar47,1);
                iVar9 = (int)iVar35;
                pBVar47 = local_340;
                if (local_340 == (BlobShape *)0x0) {
                  pBVar47 = (BlobShape *)&caffe::_BlobShape_default_instance_;
                }
                iVar35 = caffe::BlobShape::dim(pBVar47,2);
                local_538 = (int)iVar35;
              }
              else if (iVar58 == 0) {
                if (((local_334 == 0) || (local_330 == 0)) ||
                   (local_538 = local_32c, iVar58 = local_334, iVar9 = local_330, local_32c == 0)) {
                  std::__cxx11::stringstream::stringstream((stringstream *)&dims);
                  poVar15 = std::operator<<((ostream *)
                                            &dims.super__Vector_base<long,_std::allocator<long>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                                            "Shape of mean image (C, H, W) in binary proto cannot be 0. "
                                           );
                  std::endl<char,std::char_traits<char>>(poVar15);
                  prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::stringbuf::str();
                  std::runtime_error::runtime_error(prVar41,(string *)&class_buffer);
                  __cxa_throw(prVar41,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
              }
              else {
                if ((iVar58 != 2) || (iVar49 != 1)) {
                  std::__cxx11::stringstream::stringstream((stringstream *)&dims);
                  poVar15 = std::operator<<((ostream *)
                                            &dims.super__Vector_base<long,_std::allocator<long>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                                            "Shape of mean image in binary proto must be either 2D (grayscale) [H,W] or 3D [C,H,W]. "
                                           );
                  std::endl<char,std::char_traits<char>>(poVar15);
                  prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::stringbuf::str();
                  std::runtime_error::runtime_error(prVar41,(string *)&class_buffer);
                  __cxa_throw(prVar41,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                iVar35 = caffe::BlobShape::dim(pBVar47,0);
                iVar9 = (int)iVar35;
                pBVar47 = local_340;
                if (local_340 == (BlobShape *)0x0) {
                  pBVar47 = (BlobShape *)&caffe::_BlobShape_default_instance_;
                }
                iVar35 = caffe::BlobShape::dim(pBVar47,1);
                local_538 = (int)iVar35;
                iVar58 = 1;
              }
              if (iVar45 != iVar58 * iVar9 * local_538) {
                std::__cxx11::stringstream::stringstream((stringstream *)&dims);
                poVar15 = std::operator<<((ostream *)
                                          &dims.super__Vector_base<long,_std::allocator<long>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                                          "Size of data in mean image binary proto must be consistent with its shape (C,H,W). "
                                         );
                std::endl<char,std::char_traits<char>>(poVar15);
                prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(prVar41,(string *)&class_buffer);
                __cxa_throw(prVar41,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              if ((iVar9 < iVar4) || (local_538 < iVar48)) {
                std::__cxx11::stringstream::stringstream((stringstream *)&dims);
                poVar15 = std::operator<<((ostream *)
                                          &dims.super__Vector_base<long,_std::allocator<long>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                                          "Height and width of the mean image must be greater than or equal to the input image size. "
                                         );
                std::endl<char,std::char_traits<char>>(poVar15);
                prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(prVar41,(string *)&class_buffer);
                __cxa_throw(prVar41,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              CoreML::Specification::NeuralNetworkPreprocessing::set_featurename
                        (pNVar29,(string *)unaff_R12);
              pNVar36 = CoreML::Specification::NeuralNetworkPreprocessing::mutable_meanimage
                                  (pNVar29);
              pRVar50 = &pNVar36->meanimage_;
              dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)((ulong)dims.super__Vector_base<long,_std::allocator<long>_>.
                                          _M_impl.super__Vector_impl_data._M_start &
                                  0xffffffff00000000);
              google::protobuf::RepeatedField<float>::Resize
                        (pRVar50,iVar4 * iVar49 * iVar48,(float *)&dims);
              if ((iVar9 - iVar4 == 0 || iVar9 < iVar4) && (local_538 <= iVar48)) {
                google::protobuf::RepeatedField<float>::CopyFrom
                          (pRVar50,(RepeatedField<float> *)&layerConvertFn._M_invoker);
              }
              else {
                std::__cxx11::stringstream::stringstream((stringstream *)&dims);
                poVar15 = std::operator<<((ostream *)
                                          &dims.super__Vector_base<long,_std::allocator<long>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                                          "Size of mean image: (H,W) = (");
                poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar9);
                poVar15 = std::operator<<(poVar15,", ");
                poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,local_538);
                std::operator<<(poVar15,") is greater than input image size: (H,W) = (");
                poVar15 = (ostream *)
                          std::ostream::operator<<
                                    ((ostream *)
                                     &dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage,iVar4);
                poVar15 = std::operator<<(poVar15,", ");
                poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar48);
                poVar15 = std::operator<<(poVar15,
                                          "). Mean image will be center cropped to match the input image dimensions. "
                                         );
                std::endl<char,std::char_traits<char>>(poVar15);
                std::__cxx11::stringbuf::str();
                std::operator<<((ostream *)&std::cout,(string *)&class_buffer);
                std::__cxx11::string::~string((string *)&class_buffer);
                iVar58 = 0;
                iVar45 = 0;
                if (0 < iVar48) {
                  iVar45 = iVar48;
                }
                iVar42 = 0;
                if (0 < iVar4) {
                  iVar42 = iVar4;
                }
                if (iVar49 < 1) {
                  iVar49 = 0;
                }
                iVar51 = ((iVar9 - iVar4) / 2) * local_538 + (local_538 - iVar48) / 2;
                for (iVar10 = 0; iVar10 != iVar49; iVar10 = iVar10 + 1) {
                  iVar53 = iVar51;
                  iVar57 = iVar58;
                  for (iVar11 = 0; iVar52 = iVar53, iVar56 = iVar57, iVar55 = iVar45,
                      iVar11 != iVar42; iVar11 = iVar11 + 1) {
                    while (bVar8 = iVar55 != 0, iVar55 = iVar55 + -1, bVar8) {
                      fVar60 = caffe::BlobProto::data((BlobProto *)&layerConvertFn,iVar52);
                      class_buffer._M_dataplus._M_p._0_4_ = fVar60;
                      google::protobuf::RepeatedField<float>::Set
                                (pRVar50,iVar56,(float *)&class_buffer);
                      iVar56 = iVar56 + 1;
                      iVar52 = iVar52 + 1;
                    }
                    iVar57 = iVar57 + iVar48;
                    iVar53 = iVar53 + local_538;
                  }
                  iVar58 = iVar58 + iVar4 * iVar48;
                  iVar51 = iVar51 + iVar9 * local_538;
                }
                std::__cxx11::stringstream::~stringstream((stringstream *)&dims);
              }
              caffe::BlobProto::~BlobProto((BlobProto *)&layerConvertFn);
            }
          }
        }
        this_01 = &pMVar20->output_;
        for (p_Var18 = networkOutputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var18 != &networkOutputs._M_t._M_impl.super__Rb_tree_header;
            p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
          pFVar21 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
                    Add(this_01);
          CoreML::Specification::FeatureDescription::set_name(pFVar21,(string *)(p_Var18 + 1));
          pFVar22 = CoreML::Specification::FeatureDescription::mutable_type(pFVar21);
          pAVar26 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar22);
          pAVar26->datatype_ = 0x10040;
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::operator<<((ostream *)&std::cout,"Network Input name(s): ");
        iVar45 = 0;
        for (p_Var18 = networkInputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var18 != &networkInputs._M_t._M_impl.super__Rb_tree_header;
            p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
          bVar8 = iVar45 != 0;
          iVar45 = iVar45 + -1;
          if (bVar8) {
            std::operator<<((ostream *)&std::cout,", ");
          }
          poVar15 = std::operator<<((ostream *)&std::cout,"\'");
          poVar15 = std::operator<<(poVar15,(string *)(p_Var18 + 1));
          std::operator<<(poVar15,"\'");
        }
        poVar15 = std::operator<<((ostream *)&std::cout,".");
        std::endl<char,std::char_traits<char>>(poVar15);
        std::operator<<((ostream *)&std::cout,"Network Output name(s): ");
        iVar45 = 0;
        for (p_Var18 = networkOutputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var18 != &networkOutputs._M_t._M_impl.super__Rb_tree_header;
            p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
          bVar8 = iVar45 != 0;
          iVar45 = iVar45 + -1;
          if (bVar8) {
            std::operator<<((ostream *)&std::cout,", ");
          }
          poVar15 = std::operator<<((ostream *)&std::cout,"\'");
          poVar15 = std::operator<<(poVar15,(string *)(p_Var18 + 1));
          std::operator<<(poVar15,"\'");
        }
        poVar15 = std::operator<<((ostream *)&std::cout,".");
        poVar15 = std::endl<char,std::char_traits<char>>(poVar15);
        std::endl<char,std::char_traits<char>>(poVar15);
        if (networkOutputs._M_t._M_impl.super__Rb_tree_header._M_node_count != 1) {
          std::__cxx11::stringstream::stringstream((stringstream *)&dims);
          poVar15 = std::operator<<((ostream *)
                                    &dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage,
                                    "Model should have exactly one output (the probabilities) to automatically make it a classifier."
                                   );
          std::endl<char,std::char_traits<char>>(poVar15);
          prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar41,(string *)&layerConvertFn);
          __cxa_throw(prVar41,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::string::string
                  ((string *)&layerConvertFn,
                   (string *)
                   (networkOutputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1));
        CoreML::Specification::ModelDescription::set_predictedprobabilitiesname
                  (pMVar20,(string *)&layerConvertFn);
        CoreML::Specification::ModelDescription::set_predictedfeaturename
                  (pMVar20,predictedFeatureName);
        pTVar37 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                            (&this_01->super_RepeatedPtrFieldBase,0);
        pFVar22 = CoreML::Specification::FeatureDescription::mutable_type(pTVar37);
        CoreML::Specification::FeatureType::mutable_dictionarytype(pFVar22);
        pTVar37 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                            (&this_01->super_RepeatedPtrFieldBase,0);
        pFVar22 = CoreML::Specification::FeatureDescription::mutable_type(pTVar37);
        this_00 = CoreML::Specification::FeatureType::mutable_dictionarytype(pFVar22);
        CoreML::Specification::DictionaryFeatureType::mutable_stringkeytype(this_00);
        class_buffer._M_dataplus._M_p = (pointer)&class_buffer.field_2;
        class_buffer._M_string_length = 0;
        class_buffer.field_2._M_local_buf[0] = '\0';
        std::ifstream::ifstream(&dims);
        std::ifstream::open((string *)&dims,(_Ios_Openmode)classInputPath);
        while (piVar38 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                   ((istream *)&dims,(string *)&class_buffer),
              ((byte)piVar38[*(long *)(*(long *)piVar38 + -0x18) + 0x20] & 5) == 0) {
          pSVar39 = CoreML::Specification::NeuralNetworkClassifier::mutable_stringclasslabels(this);
          pbVar40 = google::protobuf::
                    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::Add(&pSVar39->vector_);
          std::__cxx11::string::_M_assign((string *)pbVar40);
        }
        std::ifstream::close();
        pFVar21 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                            (this_01);
        CoreML::Specification::FeatureDescription::set_name(pFVar21,predictedFeatureName);
        pFVar22 = CoreML::Specification::FeatureDescription::mutable_type(pFVar21);
        CoreML::Specification::FeatureType::mutable_stringtype(pFVar22);
        CoreML::Specification::ModelDescription::set_predictedfeaturename
                  (pMVar20,predictedFeatureName);
        std::ifstream::~ifstream(&dims);
        std::__cxx11::string::~string((string *)&class_buffer);
        std::__cxx11::string::~string((string *)&layerConvertFn);
      }
      else {
        pNVar14 = CoreML::Specification::Model::mutable_neuralnetwork(modelSpec);
        modelSpec->specificationversion_ = 5;
        mappingDataBlobNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &mappingDataBlobNames._M_t._M_impl.super__Rb_tree_header._M_header;
        mappingDataBlobNames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        mappingDataBlobNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
        ;
        mappingDataBlobNames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header._M_header;
        mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        mapCaffeLayerNamesToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &mapCaffeLayerNamesToIndex._M_t._M_impl.super__Rb_tree_header._M_header;
        mapCaffeLayerNamesToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        mapCaffeLayerNamesToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        mapCaffeLayerNamesToIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        mapCaffeLayerNamesToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             mapCaffeLayerNamesToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        mappingDataBlobNames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             mappingDataBlobNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (iVar45 = 0;
            iVar45 < (caffeSpecWeights->layer_).super_RepeatedPtrFieldBase.current_size_;
            iVar45 = iVar45 + 1) {
          pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                              (&(caffeSpecWeights->layer_).super_RepeatedPtrFieldBase,iVar45);
          if (((pTVar12->_has_bits_).has_bits_[0] & 1) != 0) {
            pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                                (&(caffeSpecWeights->layer_).super_RepeatedPtrFieldBase,iVar45);
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::operator[](&mapCaffeLayerNamesToIndex,(pTVar12->name_).ptr_);
            *pmVar13 = iVar45;
          }
        }
        caffeNetworkInputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &caffeNetworkInputNames._M_t._M_impl.super__Rb_tree_header._M_header;
        caffeNetworkInputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        caffeNetworkInputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        caffeNetworkInputNames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        iVar45 = (caffeSpecProto->layer_).super_RepeatedPtrFieldBase.current_size_;
        caffeNetworkInputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             caffeNetworkInputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        poVar15 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar15 = std::operator<<(poVar15,
                                  "================= Starting Conversion from Caffe to CoreML ======================"
                                 );
        std::endl<char,std::char_traits<char>>(poVar15);
        for (inputNames._M_t._M_impl._0_4_ = 0; (int)inputNames._M_t._M_impl._0_4_ < iVar45;
            inputNames._M_t._M_impl._0_4_ = inputNames._M_t._M_impl._0_4_ + 1) {
          pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                              (&(caffeSpecProto->layer_).super_RepeatedPtrFieldBase,
                               inputNames._M_t._M_impl._0_4_);
          validateCaffeLayerTypeAndName(pTVar12);
          iVar49 = (pTVar12->bottom_).super_RepeatedPtrFieldBase.current_size_;
          iVar4 = (pTVar12->top_).super_RepeatedPtrFieldBase.current_size_;
          poVar15 = std::operator<<((ostream *)&std::cout,"Layer ");
          poVar15 = (ostream *)
                    std::ostream::operator<<((ostream *)poVar15,inputNames._M_t._M_impl._0_4_);
          poVar15 = std::operator<<(poVar15,": Type: \'");
          poVar15 = std::operator<<(poVar15,(string *)(pTVar12->type_).ptr_);
          poVar15 = std::operator<<(poVar15,"\', Name: \'");
          poVar15 = std::operator<<(poVar15,(string *)(pTVar12->name_).ptr_);
          std::operator<<(poVar15,"\'. ");
          if (0 < iVar49) {
            std::operator<<((ostream *)&std::cout,"Input(s): ");
            unaff_R12 = (_Rb_tree_node_base *)0x0;
            while (iVar48 = (int)unaff_R12, iVar49 != iVar48) {
              if (iVar48 != 0) {
                std::operator<<((ostream *)&std::cout,", ");
              }
              poVar15 = std::operator<<((ostream *)&std::cout,"\'");
              pTVar16 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                  (&(pTVar12->bottom_).super_RepeatedPtrFieldBase,iVar48);
              poVar15 = std::operator<<(poVar15,(string *)pTVar16);
              std::operator<<(poVar15,"\'");
              unaff_R12 = (_Rb_tree_node_base *)(ulong)(iVar48 + 1);
            }
            std::operator<<((ostream *)&std::cout,". ");
          }
          if (0 < iVar4) {
            std::operator<<((ostream *)&std::cout,"Output(s): ");
            unaff_R12 = (_Rb_tree_node_base *)0x0;
            while (iVar49 = (int)unaff_R12, iVar4 != iVar49) {
              if (iVar49 != 0) {
                std::operator<<((ostream *)&std::cout,", ");
              }
              poVar15 = std::operator<<((ostream *)&std::cout,"\'");
              pTVar16 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                  (&(pTVar12->top_).super_RepeatedPtrFieldBase,iVar49);
              poVar15 = std::operator<<(poVar15,(string *)pTVar16);
              std::operator<<(poVar15,"\'");
              unaff_R12 = (_Rb_tree_node_base *)(ulong)(iVar49 + 1);
            }
            poVar15 = std::operator<<((ostream *)&std::cout,".");
            std::endl<char,std::char_traits<char>>(poVar15);
          }
          caffeLayerRegistry(&layerConvertFn,(pTVar12->type_).ptr_);
          dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)caffeSpecProto;
          dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)caffeSpecWeights;
          dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)&pNVar14->layers_;
          if (layerConvertFn.super__Function_base._M_manager == (_Manager_type)0x0)
          goto LAB_0047e5cc;
          (*(code *)CONCAT44(layerConvertFn._M_invoker._4_4_,(int)layerConvertFn._M_invoker))
                    (&layerConvertFn,&dims);
          std::_Function_base::~_Function_base(&layerConvertFn.super__Function_base);
        }
        poVar15 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar15 = std::operator<<(poVar15,
                                  "================= Summary of the conversion: ==================================="
                                 );
        std::endl<char,std::char_traits<char>>(poVar15);
        if (mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&dims);
          pplVar3 = &dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          std::operator<<((ostream *)pplVar3,"Unable to infer input name and dimensions. ");
          poVar15 = std::operator<<((ostream *)pplVar3,
                                    "Please provide a .prototxt file with \'Input\' layer and dimensions defined."
                                   );
          std::endl<char,std::char_traits<char>>(poVar15);
          prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar41,(string *)&layerConvertFn);
          __cxa_throw(prVar41,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        poVar15 = std::operator<<((ostream *)&std::cout,
                                  "Detected input(s) and shape(s) (ignoring batch size):");
        std::endl<char,std::char_traits<char>>(poVar15);
        for (p_Var18 = mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var18 !=
            &mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header;
            p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
          poVar15 = std::operator<<((ostream *)&std::cout,"\'");
          poVar15 = std::operator<<(poVar15,(string *)(p_Var18 + 1));
          std::operator<<(poVar15,"\' : ");
          pmVar17 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                    ::at(&mapBlobNameToDimensions,(key_type *)(p_Var18 + 1));
          std::vector<long,_std::allocator<long>_>::vector
                    ((vector<long,_std::allocator<long>_> *)
                     &dims.super__Vector_base<long,_std::allocator<long>_>,pmVar17);
          for (uVar54 = 0;
              uVar54 < (ulong)((long)dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 3); uVar54 = uVar54 + 1) {
            if (uVar54 != 0) {
              std::operator<<((ostream *)&std::cout,", ");
            }
            std::ostream::_M_insert<long>((long)&std::cout);
          }
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                    (&dims.super__Vector_base<long,_std::allocator<long>_>);
        }
        inputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &inputNames._M_t._M_impl.super__Rb_tree_header._M_header;
        inputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        inputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        inputNames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        outputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &outputNames._M_t._M_impl.super__Rb_tree_header._M_header;
        outputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        outputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        outputNames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        pRVar5 = (pNVar14->layers_).super_RepeatedPtrFieldBase.rep_;
        ppvVar43 = pRVar5->elements;
        if (pRVar5 == (Rep *)0x0) {
          ppvVar43 = (void **)0x0;
        }
        ppvVar2 = ppvVar43 + (pNVar14->layers_).super_RepeatedPtrFieldBase.current_size_;
        inputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             inputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        outputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             outputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (; ppvVar43 != ppvVar2; ppvVar43 = ppvVar43 + 1) {
          pvVar6 = *ppvVar43;
          lVar46 = *(long *)((long)pvVar6 + 0x20) + 8;
          if (*(long *)((long)pvVar6 + 0x20) == 0) {
            lVar46 = 0;
          }
          iVar45 = *(int *)((long)pvVar6 + 0x18);
          for (lVar59 = 0; (long)iVar45 * 8 != lVar59; lVar59 = lVar59 + 8) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&inputNames,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar46 + lVar59));
          }
          lVar46 = *(long *)((long)pvVar6 + 0x38) + 8;
          if (*(long *)((long)pvVar6 + 0x38) == 0) {
            lVar46 = 0;
          }
          iVar45 = *(int *)((long)pvVar6 + 0x30);
          for (lVar59 = 0; (long)iVar45 * 8 != lVar59; lVar59 = lVar59 + 8) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&outputNames,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar46 + lVar59));
          }
        }
        networkInputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &networkInputs._M_t._M_impl.super__Rb_tree_header._M_header;
        networkInputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        networkInputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        networkInputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        networkInputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             networkInputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::
        __set_difference<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>,std::insert_iterator<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (inputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                   &inputNames._M_t._M_impl.super__Rb_tree_header,
                   outputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                   &outputNames._M_t._M_impl.super__Rb_tree_header,&networkInputs);
        for (p_Var18 = caffeNetworkInputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var18 != &caffeNetworkInputNames._M_t._M_impl.super__Rb_tree_header
            ; p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
          p_Var1 = p_Var18 + 1;
          iVar19 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&networkInputs,(key_type *)p_Var1);
          if ((_Rb_tree_header *)iVar19._M_node == &networkInputs._M_t._M_impl.super__Rb_tree_header
             ) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&networkInputs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var1);
            std::__cxx11::stringstream::stringstream((stringstream *)&dims);
            poVar15 = std::operator<<((ostream *)
                                      &dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage,
                                      "WARNING: The input: \'");
            poVar15 = std::operator<<(poVar15,(string *)p_Var1);
            poVar15 = std::operator<<(poVar15,
                                      "\', is dangling i.e. it does not feed into any other layer of the network."
                                     );
            std::endl<char,std::char_traits<char>>(poVar15);
            std::__cxx11::stringbuf::str();
            std::operator<<((ostream *)&std::cout,(string *)&layerConvertFn);
            std::__cxx11::string::~string((string *)&layerConvertFn);
            std::__cxx11::stringstream::~stringstream((stringstream *)&dims);
          }
        }
        networkOutputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &networkOutputs._M_t._M_impl.super__Rb_tree_header._M_header;
        networkOutputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        networkOutputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        networkOutputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        networkOutputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             networkOutputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::
        __set_difference<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>,std::insert_iterator<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (outputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                   &outputNames._M_t._M_impl.super__Rb_tree_header,
                   inputNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                   &inputNames._M_t._M_impl.super__Rb_tree_header,&networkOutputs);
        pMVar20 = CoreML::Specification::Model::mutable_description(modelSpec);
        if (networkInputs._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar41,"Unable to find any input layer for the network.");
          __cxa_throw(prVar41,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        for (p_Var18 = networkInputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var18 != &networkInputs._M_t._M_impl.super__Rb_tree_header;
            p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
          pFVar21 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
                    Add(&pMVar20->input_);
          p_Var1 = p_Var18 + 1;
          CoreML::Specification::FeatureDescription::set_name(pFVar21,(string *)p_Var1);
          pFVar22 = CoreML::Specification::FeatureDescription::mutable_type(pFVar21);
          iVar23 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                   ::find(&mapBlobNameToDimensions._M_t,(key_type *)p_Var1);
          if ((_Rb_tree_header *)iVar23._M_node ==
              &mapBlobNameToDimensions._M_t._M_impl.super__Rb_tree_header) {
            std::__cxx11::stringstream::stringstream((stringstream *)&dims);
            poVar15 = std::operator<<((ostream *)
                                      &dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage,
                                      "Unable to infer shape for the Input \'");
            poVar15 = std::operator<<(poVar15,(string *)p_Var1);
            poVar15 = std::operator<<(poVar15,"\'.");
            std::endl<char,std::char_traits<char>>(poVar15);
            prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar41,(string *)&layerConvertFn);
            __cxa_throw(prVar41,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          cVar24 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&imageInputs->_M_t,(key_type *)p_Var1);
          if ((_Rb_tree_header *)cVar24._M_node ==
              &(imageInputs->_M_t)._M_impl.super__Rb_tree_header) {
            pAVar26 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar22);
            pAVar26->datatype_ = 0x10040;
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                                    *)&mapBlobNameToDimensions._M_t,(key_type *)p_Var1);
            piVar7 = (pmVar17->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            for (piVar44 = (pmVar17->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                           super__Vector_impl_data._M_start; piVar44 != piVar7;
                piVar44 = piVar44 + 1) {
              CoreML::Specification::ArrayFeatureType::add_shape(pAVar26,*piVar44);
            }
          }
          else {
            pIVar25 = CoreML::Specification::FeatureType::mutable_imagetype(pFVar22);
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                                    *)&mapBlobNameToDimensions._M_t,(key_type *)p_Var1);
            if (*(pmVar17->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start == 1) {
              pIVar25->colorspace_ = 10;
            }
            else {
              cVar27 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                       ::find(&isBGR->_M_t,(key_type *)p_Var1);
              if (((_Rb_tree_header *)cVar27._M_node == &(isBGR->_M_t)._M_impl.super__Rb_tree_header
                  ) || (pmVar28 = std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                                  ::at(isBGR,(key_type *)p_Var1), *pmVar28 != true)) {
                pIVar25->colorspace_ = 0x14;
              }
              else {
                pIVar25->colorspace_ = 0x1e;
              }
            }
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                                    *)&mapBlobNameToDimensions._M_t,(key_type *)p_Var1);
            pIVar25->height_ =
                 (pmVar17->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start[1];
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                                    *)&mapBlobNameToDimensions._M_t,(key_type *)p_Var1);
            pIVar25->width_ =
                 (pmVar17->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start[2];
            pNVar29 = google::protobuf::
                      RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::Add
                                (&pNVar14->preprocessing_);
            iVar30 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
                     ::find(&meanImageBlobProto->_M_t,(key_type *)p_Var1);
            if ((_Rb_tree_header *)iVar30._M_node ==
                &(meanImageBlobProto->_M_t)._M_impl.super__Rb_tree_header) {
              CoreML::Specification::NeuralNetworkPreprocessing::set_featurename
                        (pNVar29,(string *)p_Var1);
              pNVar32 = CoreML::Specification::NeuralNetworkPreprocessing::mutable_scaler(pNVar29);
              cVar33 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                       ::find(&scale->_M_t,(key_type *)p_Var1);
              fVar60 = 1.0;
              if ((_Rb_tree_header *)cVar33._M_node != &(scale->_M_t)._M_impl.super__Rb_tree_header)
              {
                pmVar34 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                          ::at(scale,(key_type *)p_Var1);
                fVar60 = (float)*pmVar34;
              }
              pNVar32->channelscale_ = fVar60;
              cVar33 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                       ::find(&redBias->_M_t,(key_type *)p_Var1);
              if ((_Rb_tree_header *)cVar33._M_node !=
                  &(redBias->_M_t)._M_impl.super__Rb_tree_header) {
                pmVar34 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                          ::at(redBias,(key_type *)p_Var1);
                pNVar32->redbias_ = (float)*pmVar34;
              }
              cVar33 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                       ::find(&greenBias->_M_t,(key_type *)p_Var1);
              if ((_Rb_tree_header *)cVar33._M_node !=
                  &(greenBias->_M_t)._M_impl.super__Rb_tree_header) {
                pmVar34 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                          ::at(greenBias,(key_type *)p_Var1);
                pNVar32->greenbias_ = (float)*pmVar34;
              }
              cVar33 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                       ::find(&blueBias->_M_t,(key_type *)p_Var1);
              if ((_Rb_tree_header *)cVar33._M_node !=
                  &(blueBias->_M_t)._M_impl.super__Rb_tree_header) {
                pmVar34 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                          ::at(blueBias,(key_type *)p_Var1);
                pNVar32->bluebias_ = (float)*pmVar34;
              }
              cVar33 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                       ::find(&grayBias->_M_t,(key_type *)p_Var1);
              if ((_Rb_tree_header *)cVar33._M_node !=
                  &(grayBias->_M_t)._M_impl.super__Rb_tree_header) {
                pmVar34 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                          ::at(grayBias,(key_type *)p_Var1);
                pNVar32->graybias_ = (float)*pmVar34;
              }
            }
            else {
              pmVar31 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
                        ::at(meanImageBlobProto,(key_type *)p_Var1);
              caffe::BlobProto::BlobProto((BlobProto *)&layerConvertFn,pmVar31);
              iVar45 = (int)layerConvertFn._M_invoker;
              if ((int)layerConvertFn._M_invoker == 0) {
                std::__cxx11::stringstream::stringstream((stringstream *)&dims);
                poVar15 = std::operator<<((ostream *)
                                          &dims.super__Vector_base<long,_std::allocator<long>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                                          "There is no data in the mean image binary proto file specified for input: \'"
                                         );
                poVar15 = std::operator<<(poVar15,(string *)p_Var1);
                poVar15 = std::operator<<(poVar15,"\'.");
                std::endl<char,std::char_traits<char>>(poVar15);
                prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(prVar41,(string *)&class_buffer);
                __cxa_throw(prVar41,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              pmVar17 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                                      *)&mapBlobNameToDimensions._M_t,(key_type *)p_Var1);
              iVar49 = (int)*(pmVar17->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                             super__Vector_impl_data._M_start;
              pmVar17 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                                      *)&mapBlobNameToDimensions._M_t,(key_type *)p_Var1);
              iVar4 = (int)(pmVar17->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                           super__Vector_impl_data._M_start[1];
              pmVar17 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                                      *)&mapBlobNameToDimensions._M_t,(key_type *)p_Var1);
              pBVar47 = local_340;
              if (local_340 == (BlobShape *)0x0) {
                pBVar47 = (BlobShape *)&caffe::_BlobShape_default_instance_;
              }
              iVar48 = (int)(pmVar17->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                            super__Vector_impl_data._M_start[2];
              iVar58 = (pBVar47->dim_).current_size_;
              if (iVar58 == 3) {
                iVar35 = caffe::BlobShape::dim(pBVar47,0);
                iVar58 = (int)iVar35;
                pBVar47 = local_340;
                if (local_340 == (BlobShape *)0x0) {
                  pBVar47 = (BlobShape *)&caffe::_BlobShape_default_instance_;
                }
                iVar35 = caffe::BlobShape::dim(pBVar47,1);
                iVar9 = (int)iVar35;
                pBVar47 = local_340;
                if (local_340 == (BlobShape *)0x0) {
                  pBVar47 = (BlobShape *)&caffe::_BlobShape_default_instance_;
                }
                iVar35 = caffe::BlobShape::dim(pBVar47,2);
                local_538 = (int)iVar35;
              }
              else if (iVar58 == 0) {
                if (((local_334 == 0) || (local_330 == 0)) ||
                   (local_538 = local_32c, iVar58 = local_334, iVar9 = local_330, local_32c == 0)) {
                  std::__cxx11::stringstream::stringstream((stringstream *)&dims);
                  poVar15 = std::operator<<((ostream *)
                                            &dims.super__Vector_base<long,_std::allocator<long>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                                            "Shape of mean image (C, H, W) in binary proto cannot be 0. "
                                           );
                  std::endl<char,std::char_traits<char>>(poVar15);
                  prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::stringbuf::str();
                  std::runtime_error::runtime_error(prVar41,(string *)&class_buffer);
                  __cxa_throw(prVar41,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
              }
              else {
                if ((iVar58 != 2) || (iVar49 != 1)) {
                  std::__cxx11::stringstream::stringstream((stringstream *)&dims);
                  poVar15 = std::operator<<((ostream *)
                                            &dims.super__Vector_base<long,_std::allocator<long>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                                            "Shape of mean image in binary proto must be either 2D (grayscale) [H,W] or 3D [C,H,W]. "
                                           );
                  std::endl<char,std::char_traits<char>>(poVar15);
                  prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::stringbuf::str();
                  std::runtime_error::runtime_error(prVar41,(string *)&class_buffer);
                  __cxa_throw(prVar41,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                iVar35 = caffe::BlobShape::dim(pBVar47,0);
                iVar9 = (int)iVar35;
                pBVar47 = local_340;
                if (local_340 == (BlobShape *)0x0) {
                  pBVar47 = (BlobShape *)&caffe::_BlobShape_default_instance_;
                }
                iVar35 = caffe::BlobShape::dim(pBVar47,1);
                local_538 = (int)iVar35;
                iVar58 = 1;
              }
              if (iVar45 != iVar58 * iVar9 * local_538) {
                std::__cxx11::stringstream::stringstream((stringstream *)&dims);
                poVar15 = std::operator<<((ostream *)
                                          &dims.super__Vector_base<long,_std::allocator<long>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                                          "Size of data in mean image binary proto must be consistent with its shape (C,H,W). "
                                         );
                std::endl<char,std::char_traits<char>>(poVar15);
                prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(prVar41,(string *)&class_buffer);
                __cxa_throw(prVar41,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              if ((iVar9 < iVar4) || (local_538 < iVar48)) {
                std::__cxx11::stringstream::stringstream((stringstream *)&dims);
                poVar15 = std::operator<<((ostream *)
                                          &dims.super__Vector_base<long,_std::allocator<long>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                                          "Height and width of the mean image must be greater than or equal to the input image size. "
                                         );
                std::endl<char,std::char_traits<char>>(poVar15);
                prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(prVar41,(string *)&class_buffer);
                __cxa_throw(prVar41,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              CoreML::Specification::NeuralNetworkPreprocessing::set_featurename
                        (pNVar29,(string *)p_Var1);
              pNVar36 = CoreML::Specification::NeuralNetworkPreprocessing::mutable_meanimage
                                  (pNVar29);
              pRVar50 = &pNVar36->meanimage_;
              dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)((ulong)dims.super__Vector_base<long,_std::allocator<long>_>.
                                          _M_impl.super__Vector_impl_data._M_start &
                                  0xffffffff00000000);
              google::protobuf::RepeatedField<float>::Resize
                        (pRVar50,iVar4 * iVar49 * iVar48,(float *)&dims);
              if ((iVar9 - iVar4 == 0 || iVar9 < iVar4) && (local_538 <= iVar48)) {
                google::protobuf::RepeatedField<float>::CopyFrom
                          (pRVar50,(RepeatedField<float> *)&layerConvertFn._M_invoker);
              }
              else {
                std::__cxx11::stringstream::stringstream((stringstream *)&dims);
                poVar15 = std::operator<<((ostream *)
                                          &dims.super__Vector_base<long,_std::allocator<long>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                                          "Size of mean image: (H,W) = (");
                poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar9);
                poVar15 = std::operator<<(poVar15,", ");
                poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,local_538);
                std::operator<<(poVar15,") is greater than input image size: (H,W) = (");
                poVar15 = (ostream *)
                          std::ostream::operator<<
                                    ((ostream *)
                                     &dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage,iVar4);
                poVar15 = std::operator<<(poVar15,", ");
                poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar48);
                poVar15 = std::operator<<(poVar15,
                                          "). Mean image will be center cropped to match the input image dimensions. "
                                         );
                std::endl<char,std::char_traits<char>>(poVar15);
                std::__cxx11::stringbuf::str();
                std::operator<<((ostream *)&std::cout,(string *)&class_buffer);
                std::__cxx11::string::~string((string *)&class_buffer);
                iVar58 = 0;
                iVar45 = 0;
                if (0 < iVar48) {
                  iVar45 = iVar48;
                }
                iVar42 = 0;
                if (0 < iVar4) {
                  iVar42 = iVar4;
                }
                if (iVar49 < 1) {
                  iVar49 = 0;
                }
                iVar51 = ((iVar9 - iVar4) / 2) * local_538 + (local_538 - iVar48) / 2;
                for (iVar10 = 0; iVar10 != iVar49; iVar10 = iVar10 + 1) {
                  iVar53 = iVar51;
                  iVar57 = iVar58;
                  for (iVar11 = 0; iVar52 = iVar53, iVar56 = iVar57, iVar55 = iVar45,
                      iVar11 != iVar42; iVar11 = iVar11 + 1) {
                    while (bVar8 = iVar55 != 0, iVar55 = iVar55 + -1, bVar8) {
                      fVar60 = caffe::BlobProto::data((BlobProto *)&layerConvertFn,iVar52);
                      class_buffer._M_dataplus._M_p._0_4_ = fVar60;
                      google::protobuf::RepeatedField<float>::Set
                                (pRVar50,iVar56,(float *)&class_buffer);
                      iVar56 = iVar56 + 1;
                      iVar52 = iVar52 + 1;
                    }
                    iVar57 = iVar57 + iVar48;
                    iVar53 = iVar53 + local_538;
                  }
                  iVar58 = iVar58 + iVar4 * iVar48;
                  iVar51 = iVar51 + iVar9 * local_538;
                }
                std::__cxx11::stringstream::~stringstream((stringstream *)&dims);
              }
              caffe::BlobProto::~BlobProto((BlobProto *)&layerConvertFn);
            }
          }
        }
        for (p_Var18 = networkOutputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var18 != &networkOutputs._M_t._M_impl.super__Rb_tree_header;
            p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
          pFVar21 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
                    Add(&pMVar20->output_);
          CoreML::Specification::FeatureDescription::set_name(pFVar21,(string *)(p_Var18 + 1));
          pFVar22 = CoreML::Specification::FeatureDescription::mutable_type(pFVar21);
          pAVar26 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar22);
          pAVar26->datatype_ = 0x10040;
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::operator<<((ostream *)&std::cout,"Network Input name(s): ");
        iVar45 = 0;
        for (p_Var18 = networkInputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var18 != &networkInputs._M_t._M_impl.super__Rb_tree_header;
            p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
          bVar8 = iVar45 != 0;
          iVar45 = iVar45 + -1;
          if (bVar8) {
            std::operator<<((ostream *)&std::cout,", ");
          }
          poVar15 = std::operator<<((ostream *)&std::cout,"\'");
          poVar15 = std::operator<<(poVar15,(string *)(p_Var18 + 1));
          std::operator<<(poVar15,"\'");
        }
        poVar15 = std::operator<<((ostream *)&std::cout,".");
        std::endl<char,std::char_traits<char>>(poVar15);
        std::operator<<((ostream *)&std::cout,"Network Output name(s): ");
        iVar45 = 0;
        for (p_Var18 = networkOutputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var18 != &networkOutputs._M_t._M_impl.super__Rb_tree_header;
            p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
          bVar8 = iVar45 != 0;
          iVar45 = iVar45 + -1;
          if (bVar8) {
            std::operator<<((ostream *)&std::cout,", ");
          }
          poVar15 = std::operator<<((ostream *)&std::cout,"\'");
          poVar15 = std::operator<<(poVar15,(string *)(p_Var18 + 1));
          std::operator<<(poVar15,"\'");
        }
        poVar15 = std::operator<<((ostream *)&std::cout,".");
        poVar15 = std::endl<char,std::char_traits<char>>(poVar15);
        std::endl<char,std::char_traits<char>>(poVar15);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&networkOutputs._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&networkInputs._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&outputNames._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&inputNames._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&caffeNetworkInputNames._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&mapCaffeLayerNamesToIndex._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
      ::~_Rb_tree(&mapBlobNameToDimensions._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&mappingDataBlobNames._M_t);
      return;
    }
    prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar41,"Caffemodel file is not version 2. Please save this model using Caffe V2.");
  }
  else {
    prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar41,
               "Caffe prototxt file is not version 2. Please save this model using Caffe V2.");
  }
  __cxa_throw(prVar41,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CoreMLConverter::convertCaffeNetwork(caffe::NetParameter& caffeSpecWeights,
                                          caffe::NetParameter& caffeSpecProto,
                                          std::map<std::string, caffe::BlobProto>& meanImageBlobProto,
                                          Specification::Model& modelSpec,
                                          const std::map<std::string, bool>& isBGR,
                                          const std::map<std::string, double>& redBias,
                                          const std::map<std::string, double>& blueBias,
                                          const std::map<std::string, double>& greenBias,
                                          const std::map<std::string, double>& grayBias,
                                          const std::map<std::string, double>& scale,
                                          const std::set<std::string>& imageInputs,
                                          const std::string& classInputPath,
                                          const std::string& predictedFeatureName) {
    
    
    // Currently, we don't support caffe V1 or V0.
    if (caffeSpecProto.layers_size() != 0) {
        throw std::runtime_error("Caffe prototxt file is not version 2. Please save this model using Caffe V2.");
    }
    if (caffeSpecWeights.layers_size() != 0) {
        throw std::runtime_error("Caffemodel file is not version 2. Please save this model using Caffe V2.");
    }
    
    if (classInputPath != "") {
        // we have class labels, produce a classifier
        _convertCaffeNetwork(caffeSpecWeights,
                             caffeSpecProto,
                             meanImageBlobProto,
                             modelSpec,
                             imageInputs,
                             isBGR,
                             redBias,
                             blueBias,
                             greenBias,
                             grayBias,
                             scale,
                             classInputPath,
                             predictedFeatureName,
                             modelSpec.mutable_neuralnetworkclassifier());
    } else {
        _convertCaffeNetwork(caffeSpecWeights,
                             caffeSpecProto,
                             meanImageBlobProto,
                             modelSpec,
                             imageInputs,
                             isBGR,
                             redBias,
                             blueBias,
                             greenBias,
                             grayBias,
                             scale,
                             classInputPath,
                             predictedFeatureName,
                             modelSpec.mutable_neuralnetwork());
    }
}